

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_immtalk(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  __type_conflict2 _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *arg2;
  char *pcVar7;
  char *pcVar8;
  int *piVar9;
  char *in_RSI;
  v9 *this;
  CHAR_DATA *in_RDI;
  CHAR_DATA *wch;
  string buffer;
  int level;
  char arg1 [4608];
  char buf2 [4608];
  CHAR_DATA *in_stack_ffffffffffffd908;
  char *in_stack_ffffffffffffd910;
  CHAR_DATA *in_stack_ffffffffffffd918;
  undefined4 in_stack_ffffffffffffd920;
  undefined4 in_stack_ffffffffffffd924;
  CHAR_DATA *in_stack_ffffffffffffd928;
  int local_261c;
  CHAR_DATA *local_2618;
  char *local_2600 [2];
  char (*local_25f0 [2]) [4608];
  string local_25e0 [36];
  int local_25bc;
  v9 local_25b8 [296];
  format_args in_stack_ffffffffffffdb70;
  string_view in_stack_ffffffffffffdb80;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_13b8 [287];
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 local_180;
  undefined1 *local_178;
  char (*local_170) [4608];
  size_t local_168;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_160;
  v9 *local_158;
  char (*local_150) [4608];
  size_t sStack_148;
  string *local_140;
  char *local_138;
  char (**local_130) [4608];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_128 [3];
  undefined8 local_110;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_108;
  char *local_100;
  size_t local_f8;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_f0;
  char *local_e8;
  size_t sStack_e0;
  string *local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char (**local_a8) [4608];
  char (**local_a0) [4608];
  char (*local_98) [4608];
  size_t sStack_90;
  undefined1 *local_88;
  undefined8 *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_10;
  char *local_8;
  
  bVar3 = is_immortal(in_stack_ffffffffffffd908);
  if (bVar3) {
    if (*in_RSI == '\0') {
      uVar1 = in_RDI->comm[0];
      _Var2 = std::pow<int,int>(0,0x524d54);
      if ((uVar1 & (long)_Var2) == 0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                     in_stack_ffffffffffffd918);
        _Var2 = std::pow<int,int>(0,0x524dcb);
        in_RDI->comm[0] = (long)_Var2 | in_RDI->comm[0];
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                     in_stack_ffffffffffffd918);
        _Var2 = std::pow<int,int>(0,0x524d8a);
        in_RDI->comm[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & in_RDI->comm[0];
      }
    }
    else {
      sprintf((char *)&local_13b8[0].int_value,"%s",in_RSI);
      this = local_25b8;
      arg2 = one_argument(in_stack_ffffffffffffd910,(char *)in_stack_ffffffffffffd908);
      if (local_25b8[0] == (v9)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                     in_stack_ffffffffffffd918);
      }
      else {
        local_25bc = 0x33;
        bVar3 = is_number((char *)in_stack_ffffffffffffd908);
        if (bVar3) {
          iVar6 = atoi((char *)local_25b8);
          local_25bc = iVar6;
          iVar5 = get_trust(in_stack_ffffffffffffd908);
          if ((iVar5 < iVar6) || (local_25bc < 0x33)) {
            local_25bc = 0x33;
          }
          else {
            this = (v9 *)0x7f0704;
            sprintf((char *)&local_13b8[0].int_value,"%s",arg2);
          }
        }
        if ((bool)local_13b8[0]._0_1_ == false) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd924,in_stack_ffffffffffffd920),
                       in_stack_ffffffffffffd918);
        }
        else {
          if (local_25bc < 0x34) {
            local_c8 = local_2600;
            local_d0 = ": {}";
            local_c0 = ": {}";
            local_2600[0] = ": {}";
            local_b8 = local_c8;
            local_f8 = std::char_traits<char>::length((char_type *)0x52515b);
            local_8 = local_d0;
            local_d8 = local_25e0;
            local_e8 = local_2600[0];
            local_f0 = local_13b8;
            local_50 = &local_e8;
            local_100 = local_2600[0];
            sStack_e0 = local_f8;
            local_48 = local_100;
            sStack_40 = local_f8;
            local_128[0] = fmt::v9::
                           make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                     ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
                                       *)&local_f0->string,this,(char (*) [4608])local_d8);
            local_30 = &local_110;
            local_38 = local_128;
            local_20 = 0xc;
            local_110 = 0xc;
            local_28 = local_38;
            local_18 = local_30;
            local_10 = local_38;
            local_108 = local_38;
            fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdb80,in_stack_ffffffffffffdb70);
          }
          else {
            local_130 = local_25f0;
            local_138 = " [{}]: {}";
            local_b0 = " [{}]: {}";
            local_25f0[0] = (char (*) [4608])0x7bd578;
            local_a8 = local_130;
            local_168 = std::char_traits<char>::length((char_type *)0x524f78);
            local_58 = local_138;
            local_140 = local_25e0;
            local_150 = local_25f0[0];
            local_158 = (v9 *)&local_25bc;
            local_160 = local_13b8;
            local_a0 = &local_150;
            local_170 = local_25f0[0];
            sStack_148 = local_168;
            local_98 = local_170;
            sStack_90 = local_168;
            fmt::v9::
            make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,int&,char(&)[4608]>
                      ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char[4608]>
                        *)&stack0xfffffffffffffe58,local_158,&local_160->int_value,local_25f0[0]);
            local_80 = &local_180;
            local_88 = &stack0xfffffffffffffe58;
            local_70 = 0xc1;
            local_180 = 0xc1;
            local_78 = local_88;
            local_68 = local_80;
            local_60 = local_88;
            local_178 = local_88;
            fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffdb80,in_stack_ffffffffffffdb70);
          }
          _Var2 = std::pow<int,int>(0,0x5252ce);
          in_RDI->comm[0] = in_RDI->comm[0] & ~(long)_Var2;
          uVar1 = in_RDI->comm[0];
          _Var2 = std::pow<int,int>(0,0x525329);
          if ((uVar1 & (long)_Var2) == 0) {
            std::__cxx11::string::data();
            act_new((char *)in_stack_fffffffffffffe60,(CHAR_DATA *)in_stack_fffffffffffffe58,in_RDI,
                    arg2,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
          }
          else {
            pcVar7 = get_char_color(in_stack_ffffffffffffd928,
                                    (char *)CONCAT44(in_stack_ffffffffffffd924,
                                                     in_stack_ffffffffffffd920));
            pcVar8 = END_COLOR(in_stack_ffffffffffffd918);
            sprintf((char *)&local_13b8[0].int_value,"%s[IMM] $n$t%s",pcVar7,pcVar8);
            std::__cxx11::string::data();
            act_new((char *)in_stack_fffffffffffffe60,(CHAR_DATA *)in_stack_fffffffffffffe58,in_RDI,
                    arg2,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
          }
          for (local_2618 = char_list; local_2618 != (CHAR_DATA *)0x0; local_2618 = local_2618->next
              ) {
            bVar3 = is_npc(in_stack_ffffffffffffd908);
            if ((!bVar3) || (local_2618->desc != (DESCRIPTOR_DATA *)0x0)) {
              bVar3 = is_immortal(in_stack_ffffffffffffd908);
              if ((bVar3) ||
                 (uVar1 = local_2618->comm[0], _Var2 = std::pow<int,int>(0,0x52550a),
                 (uVar1 & (long)_Var2) != 0)) {
LAB_00525599:
                iVar6 = get_trust(in_stack_ffffffffffffd908);
                local_261c = 0x34;
                piVar9 = std::max<int>(&local_25bc,&local_261c);
                bVar3 = *piVar9 <= iVar6;
              }
              else {
                bVar4 = is_npc(in_stack_ffffffffffffd908);
                bVar3 = false;
                if ((bVar4) && (bVar3 = false, local_2618->desc != (DESCRIPTOR_DATA *)0x0)) {
                  bVar4 = is_immortal(in_stack_ffffffffffffd908);
                  bVar3 = false;
                  if (bVar4) goto LAB_00525599;
                }
              }
              if (bVar3) {
                uVar1 = local_2618->comm[0];
                _Var2 = std::pow<int,int>(0,0x525615);
                if ((uVar1 & (long)_Var2) == 0) {
                  std::__cxx11::string::data();
                  act_new((char *)in_stack_fffffffffffffe60,(CHAR_DATA *)in_stack_fffffffffffffe58,
                          in_RDI,arg2,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
                }
                else {
                  pcVar7 = get_char_color(in_stack_ffffffffffffd928,
                                          (char *)CONCAT44(in_stack_ffffffffffffd924,
                                                           in_stack_ffffffffffffd920));
                  in_stack_ffffffffffffd928 = (CHAR_DATA *)END_COLOR(in_stack_ffffffffffffd918);
                  in_stack_ffffffffffffd924 = 0;
                  in_stack_ffffffffffffd918 = in_RDI;
                  sprintf((char *)&local_13b8[0].int_value,"%s[IMM] $n$t%s",pcVar7,
                          in_stack_ffffffffffffd928);
                  in_RDI = in_stack_ffffffffffffd918;
                  std::__cxx11::string::data();
                  act_new((char *)in_stack_fffffffffffffe60,(CHAR_DATA *)in_stack_fffffffffffffe58,
                          in_RDI,arg2,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
                }
              }
            }
          }
          std::__cxx11::string::~string(local_25e0);
        }
      }
    }
  }
  return;
}

Assistant:

void do_immtalk(CHAR_DATA *ch, char *argument)
{
	if (!is_immortal(ch))
		return;

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOWIZ))
		{
			send_to_char("Immortal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOWIZ);
		}
		else
		{
			send_to_char("Immortal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOWIZ);
		}

		return;
	}

	char buf2[MAX_STRING_LENGTH];
	sprintf(buf2, "%s", argument);

	char arg1[MAX_STRING_LENGTH];
	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	int level = 51;
	if (is_number(arg1))
	{
		level = atoi(arg1);
		if (level > get_trust(ch) || level < 51)
		{
			level = 51;
		}
		else
		{
			sprintf(buf2, "%s", argument);
		}
	}

	if (buf2[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	auto buffer = level > LEVEL_HERO
		? fmt::format(" [{}]: {}", level, buf2)
		: fmt::format(": {}", buf2); //TODO: change the rest of the sprintf calls to format

	REMOVE_BIT(ch->comm, COMM_NOWIZ);

	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(ch, "immtalk"), END_COLOR(ch));
		act_new(buf2, ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}
	else
	{
		act_new("[IMM] $n$t", ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}

	for (auto wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (is_npc(wch) && wch->desc == nullptr)
			continue;

		if ((is_immortal(wch) || IS_SET(wch->comm, COMM_IMMORTAL) || (is_npc(wch) && (wch->desc != nullptr) && is_immortal(wch->desc->original))) && get_trust(wch) >= std::max(level, 52))
		{
			if (IS_SET(wch->comm, COMM_ANSI))
			{
				sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(wch, "immtalk"), END_COLOR(wch));
				act_new(buf2, ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
			else
			{
				act_new("[IMM] $n$t", ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
		}
	}
}